

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormalsUtil.h
# Opt level: O0

void MapFormalsFromPattern<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
               (ParseNodeFnc *pnodeFunc,anon_class_16_2_85211fcd fn)

{
  ParseNode *this;
  ParseNodeParamPattern *pPVar1;
  FuncInfo **in_RCX;
  anon_class_16_2_85211fcd handler;
  anon_class_16_2_85211fcd handler_00;
  ParseNodePtr rest;
  ParseNode *local_28;
  ParseNode *pnode;
  ParseNodeFnc *pnodeFunc_local;
  anon_class_16_2_85211fcd fn_local;
  
  handler.this = (ByteCodeGenerator *)fn.funcInfo;
  for (local_28 = pnodeFunc->pnodeParams; local_28 != (ParseNode *)0x0;
      local_28 = ParseNode::GetFormalNext(local_28)) {
    if (local_28->nop == knopParamPattern) {
      pPVar1 = ParseNode::AsParseNodeParamPattern(local_28);
      handler.funcInfo = in_RCX;
      Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                ((Parser *)(pPVar1->super_ParseNodeUni).pnode1,(ParseNodePtr)fn.this,handler);
    }
  }
  this = pnodeFunc->pnodeRest;
  if ((this != (ParseNode *)0x0) && (this->nop == knopParamPattern)) {
    pPVar1 = ParseNode::AsParseNodeParamPattern(this);
    handler_00.funcInfo = in_RCX;
    handler_00.this = handler.this;
    Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
              ((Parser *)(pPVar1->super_ParseNodeUni).pnode1,(ParseNodePtr)fn.this,handler_00);
  }
  return;
}

Assistant:

void MapFormalsFromPattern(ParseNodeFnc *pnodeFunc, Fn fn)
{
    for (ParseNode *pnode = pnodeFunc->pnodeParams; pnode != nullptr; pnode = pnode->GetFormalNext())
    {
        if (pnode->nop == knopParamPattern)
        {
            Parser::MapBindIdentifier(pnode->AsParseNodeParamPattern()->pnode1, fn);
        }
    }

    ParseNodePtr rest = pnodeFunc->pnodeRest;
    if (rest != nullptr && rest->nop == knopParamPattern)
    {
        Parser::MapBindIdentifier(rest->AsParseNodeParamPattern()->pnode1, fn);
    }
}